

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteBlif.c
# Opt level: O0

void Psr_ManWriteBlif(char *pFileName,Vec_Ptr_t *vPrs)

{
  int iVar1;
  Psr_Ntk_t *pPVar2;
  FILE *__stream;
  char *pcVar3;
  char *pcVar4;
  int local_2c;
  int i;
  FILE *pFile;
  Psr_Ntk_t *pNtk;
  Vec_Ptr_t *vPrs_local;
  char *pFileName_local;
  
  pPVar2 = Psr_ManRoot(vPrs);
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open output file \"%s\".\n",pFileName);
  }
  else {
    pcVar3 = Psr_NtkStr(pPVar2,pPVar2->iModuleName);
    pcVar4 = Extra_TimeStamp();
    fprintf(__stream,"# Design \"%s\" written by ABC on %s\n\n",pcVar3,pcVar4);
    for (local_2c = 0; iVar1 = Vec_PtrSize(vPrs), local_2c < iVar1; local_2c = local_2c + 1) {
      pPVar2 = (Psr_Ntk_t *)Vec_PtrEntry(vPrs,local_2c);
      Psr_ManWriteBlifNtk((FILE *)__stream,pPVar2);
    }
    fclose(__stream);
  }
  return;
}

Assistant:

void Psr_ManWriteBlif( char * pFileName, Vec_Ptr_t * vPrs )
{
    Psr_Ntk_t * pNtk = Psr_ManRoot(vPrs);
    FILE * pFile = fopen( pFileName, "wb" ); int i;
    if ( pFile == NULL )
    {
        printf( "Cannot open output file \"%s\".\n", pFileName );
        return;
    }
    fprintf( pFile, "# Design \"%s\" written by ABC on %s\n\n", Psr_NtkStr(pNtk, pNtk->iModuleName), Extra_TimeStamp() );
    Vec_PtrForEachEntry( Psr_Ntk_t *, vPrs, pNtk, i )
        Psr_ManWriteBlifNtk( pFile, pNtk );
    fclose( pFile );
}